

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential.c
# Opt level: O3

IceTImage icetSequentialCompose(void)

{
  int dest;
  int iVar1;
  IceTSizeType width;
  IceTSizeType height;
  IceTBoolean IVar2;
  IceTSizeType value;
  IceTInt *params;
  int *piVar3;
  IceTSparseImage compressed_image;
  IceTImage IVar4;
  long lVar5;
  int image_dest;
  IceTInt num_proc;
  IceTSizeType piece_offset;
  IceTInt num_tiles;
  IceTInt rank;
  IceTSparseImage composited_image;
  IceTBoolean local_6a;
  int local_68;
  IceTSizeType local_64;
  int local_60;
  int local_5c;
  IceTSparseImage local_58;
  int *local_50;
  IceTInt *local_48;
  IceTInt *local_40;
  IceTVoid *local_38;
  
  icetGetIntegerv(0x10,&local_60);
  icetGetIntegerv(2,&local_5c);
  icetGetIntegerv(3,&local_68);
  local_40 = icetUnsafeStateGetInteger(0x1a);
  local_48 = icetUnsafeStateGetInteger(0x11);
  IVar2 = icetIsEnabled(0x142);
  local_6a = icetIsEnabled(0x146);
  if ((local_6a == '\0') && (1 < local_60)) {
    icetRaiseDiagnostic("Sequential strategy must collect images with more than one tile.",
                        0xfffffffb,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/sequential.c"
                        ,0x2e);
    local_6a = '\x01';
  }
  params = (IceTInt *)icetGetStateBuffer(0x1a3,local_68 << 2);
  local_38 = (IceTVoid *)icetImageNull();
  if (IVar2 == '\0') {
    if (0 < local_68) {
      lVar5 = 0;
      do {
        params[lVar5] = (IceTInt)lVar5;
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_68);
    }
  }
  else {
    icetGetIntegerv(0x29,params);
  }
  if (0 < local_60) {
    lVar5 = 0;
    local_50 = params;
    do {
      dest = local_40[lVar5];
      image_dest = dest;
      if (IVar2 != '\0') {
        image_dest = -1;
        piVar3 = local_50;
        do {
          image_dest = image_dest + 1;
          iVar1 = *piVar3;
          piVar3 = piVar3 + 1;
        } while (iVar1 != dest);
      }
      width = local_48[lVar5 * 4 + 2];
      height = local_48[lVar5 * 4 + 3];
      compressed_image = icetGetStateBufferSparseImage(0x1a0,width,height);
      icetGetCompressedTileImage((IceTInt)lVar5,compressed_image);
      icetSingleImageCompose(local_50,local_68,image_dest,compressed_image,&local_58,&local_64);
      if (local_6a == '\0') {
        value = icetSparseImageGetNumPixels(local_58);
        if (value < 1) {
          IVar4 = icetImageNull();
          icetStateSetInteger(0x8c,-1);
          icetStateSetInteger(0x8d,0);
          value = 0;
        }
        else {
          IVar4 = icetGetStateBufferImage(0x1a1,width,height);
          icetDecompressSubImage(local_58,local_64,IVar4);
          icetStateSetInteger(0x8c,(IceTInt)lVar5);
          icetStateSetInteger(0x8d,local_64);
        }
        icetStateSetInteger(0x8e,value);
        local_38 = IVar4.opaque_internals;
      }
      else {
        IVar4 = icetGetStateBufferImage((dest != local_5c) + 0x1a1,width,height);
        icetSingleImageCollect(local_58,dest,local_64,IVar4);
        if (dest == local_5c) {
          local_38 = IVar4.opaque_internals;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < local_60);
  }
  return (IceTImage)local_38;
}

Assistant:

IceTImage icetSequentialCompose(void)
{
    IceTInt num_tiles;
    IceTInt rank;
    IceTInt num_proc;
    const IceTInt *display_nodes;
    const IceTInt *tile_viewports;
    IceTBoolean ordered_composite;
    IceTBoolean image_collect;
    IceTImage my_image;
    IceTInt *compose_group;
    int i;

    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    ordered_composite = icetIsEnabled(ICET_ORDERED_COMPOSITE);
    image_collect = icetIsEnabled(ICET_COLLECT_IMAGES);

    if (!image_collect && (num_tiles > 1)) {
        icetRaiseWarning("Sequential strategy must collect images with more"
                         " than one tile.",
                         ICET_INVALID_OPERATION);
        image_collect = ICET_TRUE;
    }

    compose_group = icetGetStateBuffer(SEQUENTIAL_COMPOSE_GROUP_BUFFER,
                                       sizeof(IceTInt)*num_proc);

    my_image = icetImageNull();

    if (ordered_composite) {
	icetGetIntegerv(ICET_COMPOSITE_ORDER, compose_group);
    } else {
	for (i = 0; i < num_proc; i++) {
	    compose_group[i] = i;
	}
    }

  /* Render and compose every tile. */
    for (i = 0; i < num_tiles; i++) {
	int d_node = display_nodes[i];
	int image_dest;
        IceTSparseImage rendered_image;
        IceTSparseImage composited_image;
        IceTSizeType piece_offset;
        IceTSizeType tile_width;
        IceTSizeType tile_height;

        tile_width = tile_viewports[4*i + 2];
        tile_height = tile_viewports[4*i + 3];

      /* Make the image go to the display node. */
	if (ordered_composite) {
	    for (image_dest = 0; compose_group[image_dest] != d_node;
		 image_dest++);
	} else {
	  /* Technically, the above computation will work, but this is
	     faster. */
	    image_dest = d_node;
	}


        rendered_image = icetGetStateBufferSparseImage(SEQUENTIAL_IMAGE_BUFFER,
                                                       tile_width, tile_height);

        icetGetCompressedTileImage(i, rendered_image);
	icetSingleImageCompose(compose_group,
                               num_proc,
                               image_dest,
                               rendered_image,
                               &composited_image,
                               &piece_offset);

        if (image_collect) {
            IceTImage tile_image;

            /* If this processor is display node, make sure image goes to
               myColorBuffer. */
            if (d_node == rank) {
                tile_image = icetGetStateBufferImage(
                                                  SEQUENTIAL_FINAL_IMAGE_BUFFER,
                                                  tile_width, tile_height);
            } else {
                tile_image = icetGetStateBufferImage(
                                           SEQUENTIAL_INTERMEDIATE_IMAGE_BUFFER,
                                           tile_width, tile_height);
            }

            icetSingleImageCollect(composited_image,
                                   d_node,
                                   piece_offset,
                                   tile_image);

            if (d_node == rank) {
                my_image = tile_image;
            }
        } else { /* !image_collect */
            IceTSizeType piece_size
                = icetSparseImageGetNumPixels(composited_image);
            if (piece_size > 0) {
                my_image = icetGetStateBufferImage(
                                                  SEQUENTIAL_FINAL_IMAGE_BUFFER,
                                                  tile_width, tile_height);
                icetDecompressSubImage(composited_image,
                                       piece_offset,
                                       my_image);
                icetStateSetInteger(ICET_VALID_PIXELS_TILE, i);
                icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, piece_offset);
                icetStateSetInteger(ICET_VALID_PIXELS_NUM, piece_size);
            } else {
                my_image = icetImageNull();
                icetStateSetInteger(ICET_VALID_PIXELS_TILE, -1);
                icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
                icetStateSetInteger(ICET_VALID_PIXELS_NUM, 0);
            }
        }
    }

    return my_image;
}